

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_symbol.cpp
# Opt level: O0

void __thiscall FunctionTableTerm::PrintTerm(FunctionTableTerm *this)

{
  FILE *__stream;
  bool bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  reference p_Var5;
  const_iterator cStack_28;
  SymbolType tmp;
  const_iterator __end1;
  const_iterator __begin1;
  vector<_SymbolType,_std::allocator<_SymbolType>_> *__range1;
  FunctionTableTerm *this_local;
  
  fprintf((FILE *)fp_symbol,"--------------------------------------\n");
  __stream = fp_symbol;
  uVar2 = std::__cxx11::string::c_str();
  uVar3 = std::__cxx11::string::c_str();
  uVar4 = std::__cxx11::string::c_str();
  fprintf((FILE *)__stream,
          "function\nname: %s\ntop label: %s\nbottom label: %s\nargument space: %d\nreturn value space: %d\nspace length: %d\nargument type:\n"
          ,uVar2,uVar3,uVar4,(ulong)(uint)this->m_argument_space_length,
          this->m_return_value_space_length,this->m_space_length);
  __end1 = std::vector<_SymbolType,_std::allocator<_SymbolType>_>::begin(&this->m_argument_type);
  cStack_28 = std::vector<_SymbolType,_std::allocator<_SymbolType>_>::end(&this->m_argument_type);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffd8);
    if (!bVar1) break;
    p_Var5 = __gnu_cxx::
             __normal_iterator<const__SymbolType_*,_std::vector<_SymbolType,_std::allocator<_SymbolType>_>_>
             ::operator*(&__end1);
    fprintf((FILE *)fp_symbol,"\t%s\n",symbol_type_string[*p_Var5]);
    __gnu_cxx::
    __normal_iterator<const__SymbolType_*,_std::vector<_SymbolType,_std::allocator<_SymbolType>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void FunctionTableTerm::PrintTerm() const {
    fprintf(fp_symbol, "--------------------------------------\n");
    fprintf(fp_symbol, "function\nname: %s\ntop label: %s\nbottom label: %s\nargument space: %d\nreturn value space: %d\nspace length: %d\nargument type:\n",
    m_func_name.c_str(), m_top_label.c_str(), m_bottom_label.c_str(), m_argument_space_length, m_return_value_space_length, m_space_length);
    for (SymbolType tmp : m_argument_type) {
        fprintf(fp_symbol, "\t%s\n", symbol_type_string[tmp]);
    }
}